

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterXsYs<short>,_ImPlot::GetterXsYRef<short>,_ImPlot::TransformerLinLog>
::operator()(LineSegmentsRenderer<ImPlot::GetterXsYs<short>,_ImPlot::GetterXsYRef<short>,_ImPlot::TransformerLinLog>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  double dVar2;
  ImVec2 IVar3;
  short sVar4;
  int iVar5;
  ImU32 IVar6;
  GetterXsYs<short> *pGVar7;
  TransformerLinLog *pTVar8;
  ImPlotPlot *pIVar9;
  GetterXsYRef<short> *pGVar10;
  ImDrawVert *pIVar11;
  uint *puVar12;
  ImPlotContext *pIVar13;
  ImPlotContext *pIVar14;
  long lVar15;
  bool bVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  double dVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  
  pIVar13 = GImPlot;
  pGVar7 = this->Getter1;
  pTVar8 = this->Transformer;
  iVar5 = pGVar7->Count;
  lVar15 = (long)(((pGVar7->Offset + prim) % iVar5 + iVar5) % iVar5) * (long)pGVar7->Stride;
  sVar4 = *(short *)((long)pGVar7->Xs + lVar15);
  dVar20 = log10((double)(int)*(short *)((long)pGVar7->Ys + lVar15) /
                 GImPlot->CurrentPlot->YAxis[pTVar8->YAxis].Range.Min);
  pIVar14 = GImPlot;
  iVar5 = pTVar8->YAxis;
  pIVar9 = pIVar13->CurrentPlot;
  dVar2 = pIVar9->YAxis[iVar5].Range.Min;
  fVar21 = (float)(((double)(int)sVar4 - (pIVar9->XAxis).Range.Min) * pIVar13->Mx +
                  (double)pIVar13->PixelRange[iVar5].Min.x);
  fVar17 = (float)((((double)(float)(dVar20 / pIVar13->LogDenY[iVar5]) *
                     (pIVar9->YAxis[iVar5].Range.Max - dVar2) + dVar2) - dVar2) * pIVar13->My[iVar5]
                  + (double)pIVar13->PixelRange[iVar5].Min.y);
  pGVar10 = this->Getter2;
  pTVar8 = this->Transformer;
  iVar5 = pGVar10->Count;
  sVar4 = *(short *)((long)pGVar10->Xs +
                    (long)(((prim + pGVar10->Offset) % iVar5 + iVar5) % iVar5) *
                    (long)pGVar10->Stride);
  dVar20 = log10(pGVar10->YRef / GImPlot->CurrentPlot->YAxis[pTVar8->YAxis].Range.Min);
  iVar5 = pTVar8->YAxis;
  pIVar9 = pIVar14->CurrentPlot;
  dVar2 = pIVar9->YAxis[iVar5].Range.Min;
  fVar22 = (float)(((double)(int)sVar4 - (pIVar9->XAxis).Range.Min) * pIVar14->Mx +
                  (double)pIVar14->PixelRange[iVar5].Min.x);
  fVar23 = (float)((((double)(float)(dVar20 / pIVar14->LogDenY[iVar5]) *
                     (pIVar9->YAxis[iVar5].Range.Max - dVar2) + dVar2) - dVar2) * pIVar14->My[iVar5]
                  + (double)pIVar14->PixelRange[iVar5].Min.y);
  fVar18 = fVar17;
  if (fVar23 <= fVar17) {
    fVar18 = fVar23;
  }
  bVar16 = false;
  if ((fVar18 < (cull_rect->Max).y) &&
     (fVar18 = (float)(~-(uint)(fVar23 <= fVar17) & (uint)fVar23 |
                      -(uint)(fVar23 <= fVar17) & (uint)fVar17), pfVar1 = &(cull_rect->Min).y,
     *pfVar1 <= fVar18 && fVar18 != *pfVar1)) {
    fVar18 = fVar21;
    if (fVar22 <= fVar21) {
      fVar18 = fVar22;
    }
    bVar16 = false;
    if (fVar18 < (cull_rect->Max).x) {
      fVar18 = (float)(~-(uint)(fVar22 <= fVar21) & (uint)fVar22 |
                      -(uint)(fVar22 <= fVar21) & (uint)fVar21);
      bVar16 = (cull_rect->Min).x <= fVar18 && fVar18 != (cull_rect->Min).x;
    }
  }
  if (bVar16 != false) {
    fVar18 = this->Weight;
    IVar6 = this->Col;
    IVar3 = *uv;
    fVar24 = fVar22 - fVar21;
    fVar25 = fVar23 - fVar17;
    fVar19 = fVar24 * fVar24 + fVar25 * fVar25;
    if (0.0 < fVar19) {
      if (fVar19 < 0.0) {
        fVar19 = sqrtf(fVar19);
      }
      else {
        fVar19 = SQRT(fVar19);
      }
      fVar24 = fVar24 * (1.0 / fVar19);
      fVar25 = fVar25 * (1.0 / fVar19);
    }
    fVar18 = fVar18 * 0.5;
    fVar24 = fVar24 * fVar18;
    fVar18 = fVar18 * fVar25;
    pIVar11 = DrawList->_VtxWritePtr;
    (pIVar11->pos).x = fVar18 + fVar21;
    (pIVar11->pos).y = fVar17 - fVar24;
    pIVar11->uv = IVar3;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11->col = IVar6;
    pIVar11[1].pos.x = fVar18 + fVar22;
    pIVar11[1].pos.y = fVar23 - fVar24;
    pIVar11[1].uv = IVar3;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[1].col = IVar6;
    pIVar11[2].pos.x = fVar22 - fVar18;
    pIVar11[2].pos.y = fVar24 + fVar23;
    pIVar11[2].uv = IVar3;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[2].col = IVar6;
    pIVar11[3].pos.x = fVar21 - fVar18;
    pIVar11[3].pos.y = fVar24 + fVar17;
    pIVar11[3].uv = IVar3;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[3].col = IVar6;
    DrawList->_VtxWritePtr = pIVar11 + 4;
    puVar12 = DrawList->_IdxWritePtr;
    *puVar12 = DrawList->_VtxCurrentIdx;
    puVar12[1] = DrawList->_VtxCurrentIdx + 1;
    puVar12[2] = DrawList->_VtxCurrentIdx + 2;
    puVar12[3] = DrawList->_VtxCurrentIdx;
    puVar12[4] = DrawList->_VtxCurrentIdx + 2;
    puVar12[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar12 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  }
  return bVar16;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }